

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic3_l3.c
# Opt level: O0

int picnic3_l3_read_public_key(picnic3_l3_publickey_t *key,uint8_t *buf,size_t buflen)

{
  picnic_instance_t *ppVar1;
  ulong in_RDX;
  char *in_RSI;
  void *in_RDI;
  picnic_instance_t *instance;
  picnic_params_t param;
  int local_4;
  
  if (((in_RDI == (void *)0x0) || (in_RSI == (char *)0x0)) || (in_RDX == 0)) {
    local_4 = -1;
  }
  else if (*in_RSI == '\b') {
    ppVar1 = picnic_instance_get(Picnic3_L3);
    if (ppVar1 == (picnic_instance_t *)0x0) {
      local_4 = -1;
    }
    else if (in_RDX < 0x31) {
      local_4 = -1;
    }
    else {
      memcpy(in_RDI,in_RSI + 1,0x30);
      local_4 = 0;
    }
  }
  else {
    local_4 = -1;
  }
  return local_4;
}

Assistant:

int PICNIC_CALLING_CONVENTION picnic3_l3_read_public_key(picnic3_l3_publickey_t* key,
                                                           const uint8_t* buf, size_t buflen) {
  if (!key || !buf || buflen < 1) {
    return -1;
  }

  const picnic_params_t param = buf[0];
  if (param != PARAM) {
    return -1;
  }
  const picnic_instance_t* instance = picnic_instance_get(PARAM);
  if (!instance) {
    return -1;
  }

  if (buflen < PUBLIC_KEY_SIZE) {
    return -1;
  }

#if (LOWMC_BLOCK_BITS & 0x7) != 0
  static const unsigned int diff = LOWMC_BLOCK_SZ * 8 - LOWMC_BLOCK_BITS;
  if (check_padding_bits(buf[1 + LOWMC_BLOCK_SZ - 1], diff) ||
      check_padding_bits(buf[1 + 2 * LOWMC_BLOCK_SZ - 1], diff)) {
    return -1;
  }
#endif

  memcpy(key->data, buf + 1, PUBLIC_KEY_SIZE - 1);
  return 0;
}